

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

ostream * pstd::operator<<(ostream *os,optional<pbrt::Bounds2<float>_> *opt)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  string local_40;
  
  bVar1 = opt->set;
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ pstd::optional<",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(os,"N4pbrt7Bounds2IfEE",0x12);
  if (bVar1 == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"> set: true ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(os,"value: ",7);
    if (opt->set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xef,"Check failed: %s",(char (*) [4])0x2f0d9cd);
    }
    pbrt::Bounds2<float>::ToString_abi_cxx11_(&local_40,(Bounds2<float> *)opt);
    os = std::__ostream_insert<char,std::char_traits<char>>
                   (os,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = " ]";
    lVar2 = 2;
  }
  else {
    pcVar3 = "> set: false value: n/a ]";
    lVar2 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return os;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}